

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O2

float Map_TimeCutComputeArrival(Map_Node_t *pNode,Map_Cut_t *pCut,int fPhase,float tWorstLimit)

{
  uint uVar1;
  uint uVar2;
  Map_Super_t *pMVar3;
  float *pfVar4;
  Map_Node_t *pMVar5;
  uint uVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pMVar3 = pCut->M[fPhase].pSuperBest;
  uVar2 = pCut->M[fPhase].uPhaseBest;
  pfVar4 = pNode->p->pNodeDelays;
  fVar8 = 0.0;
  if (pfVar4 != (float *)0x0) {
    fVar8 = pfVar4[pNode->Num];
  }
  pCut->M[fPhase].tArrive.Rise = 0.0;
  pCut->M[fPhase].tArrive.Fall = 0.0;
  pCut->M[fPhase].tArrive.Worst = 3.4028235e+37;
  fVar10 = 0.0;
  fVar12 = 0.0;
  fVar9 = 0.0;
  fVar11 = 0.0;
  fVar13 = 0.0;
  uVar6 = (int)pCut->nLeaves;
  while( true ) {
    do {
      if ((int)uVar6 < 1) {
        if (fVar12 <= fVar13) {
          fVar12 = fVar13;
        }
        pCut->M[fPhase].tArrive.Worst = fVar12;
        return fVar12;
      }
      uVar1 = uVar6 - 1;
      bVar7 = (~uVar2 >> ((byte)((char)uVar6 - 1) & 0x1f) & 1) != 0;
      pMVar5 = pCut->ppLeaves[uVar1];
      fVar14 = pMVar3->tDelaysR[uVar1].Rise;
      if (0.0 < fVar14) {
        fVar14 = fVar14 + pMVar5->tArrival[bVar7].Rise + fVar8;
        if (tWorstLimit < fVar14) {
          return 3.4028235e+37;
        }
        fVar12 = fVar10;
        if (fVar10 < fVar14) {
          pCut->M[fPhase].tArrive.Rise = fVar14;
          fVar10 = fVar14;
          fVar12 = fVar14;
        }
      }
      fVar14 = pMVar3->tDelaysR[uVar1].Fall;
      if (0.0 < fVar14) {
        fVar14 = fVar14 + pMVar5->tArrival[bVar7].Fall + fVar8;
        if (tWorstLimit < fVar14) {
          return 3.4028235e+37;
        }
        fVar12 = fVar10;
        if (fVar10 < fVar14) {
          pCut->M[fPhase].tArrive.Rise = fVar14;
          fVar10 = fVar14;
          fVar12 = fVar14;
        }
      }
      fVar14 = pMVar3->tDelaysF[uVar1].Rise;
      if (0.0 < fVar14) {
        fVar14 = fVar14 + pMVar5->tArrival[bVar7].Rise + fVar8;
        if (tWorstLimit < fVar14) {
          return 3.4028235e+37;
        }
        fVar13 = fVar11;
        if (fVar11 < fVar14) {
          pCut->M[fPhase].tArrive.Fall = fVar14;
          fVar9 = fVar14;
          fVar11 = fVar14;
          fVar13 = fVar14;
        }
      }
      fVar14 = pMVar3->tDelaysF[uVar1].Fall;
      uVar6 = uVar1;
    } while (fVar14 <= 0.0);
    fVar14 = fVar14 + pMVar5->tArrival[bVar7].Fall + fVar8;
    if (tWorstLimit < fVar14) break;
    fVar11 = fVar9;
    fVar13 = fVar9;
    if (fVar9 < fVar14) {
      pCut->M[fPhase].tArrive.Fall = fVar14;
      fVar9 = fVar14;
      fVar11 = fVar14;
      fVar13 = fVar14;
    }
  }
  return 3.4028235e+37;
}

Assistant:

float Map_TimeCutComputeArrival( Map_Node_t * pNode, Map_Cut_t * pCut, int fPhase, float tWorstLimit )
{
    Map_Match_t * pM = pCut->M + fPhase;
    Map_Super_t * pSuper = pM->pSuperBest;
    unsigned uPhaseTot = pM->uPhaseBest;
    Map_Time_t * ptArrRes = &pM->tArrive;
    Map_Time_t * ptArrIn;
    int fPinPhase;
    float tDelay, tExtra;
    int i;

    tExtra = pNode->p->pNodeDelays ? pNode->p->pNodeDelays[pNode->Num] : 0;
    ptArrRes->Rise  = ptArrRes->Fall = 0.0;
    ptArrRes->Worst = MAP_FLOAT_LARGE;
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
    {
        // get the phase of the given pin
        fPinPhase = ((uPhaseTot & (1 << i)) == 0);
        ptArrIn = pCut->ppLeaves[i]->tArrival + fPinPhase;

        // get the rise of the output due to rise of the inputs
        if ( pSuper->tDelaysR[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysR[i].Rise + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the rise of the output due to fall of the inputs
        if ( pSuper->tDelaysR[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysR[i].Fall + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the fall of the output due to rise of the inputs
        if ( pSuper->tDelaysF[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysF[i].Rise + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }

        // get the fall of the output due to fall of the inputs
        if ( pSuper->tDelaysF[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysF[i].Fall + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }
    }
    // return the worst-case of rise/fall arrival times
    ptArrRes->Worst = MAP_MAX(ptArrRes->Rise, ptArrRes->Fall);
    return ptArrRes->Worst;
}